

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::GetIntegerIntervalFunctions<duckdb::ToMonthsOperator>(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  pointer function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbdc;
  FunctionNullHandling in_stack_fffffffffffffbe8;
  bind_lambda_function_t in_stack_fffffffffffffbf0;
  LogicalType local_408;
  scalar_function_t local_3f0;
  scalar_function_t local_3d0;
  LogicalType local_3b0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_398;
  LogicalType local_380;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_368;
  LogicalType local_350;
  LogicalType local_338;
  ScalarFunction local_320;
  ScalarFunction local_1f8;
  BaseScalarFunction local_d0;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType(&local_408,INTEGER);
  __l._M_len = 1;
  __l._M_array = &local_408;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_368,__l,(allocator_type *)&stack0xfffffffffffffbf7);
  LogicalType::LogicalType(&local_380,INTERVAL);
  local_3d0.super__Function_base._M_functor._8_8_ = 0;
  local_3d0.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::UnaryFunction<int,duckdb::interval_t,duckdb::ToMonthsOperator>;
  local_3d0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3d0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_338,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_338;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffbd4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffbdc;
  ScalarFunction::ScalarFunction
            (&local_1f8,(vector<duckdb::LogicalType,_true> *)&local_368,&local_380,&local_3d0,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffbe8,in_stack_fffffffffffffbf0);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_1f8);
  ScalarFunction::~ScalarFunction(&local_1f8);
  LogicalType::~LogicalType(&local_338);
  ::std::_Function_base::~_Function_base(&local_3d0.super__Function_base);
  LogicalType::~LogicalType(&local_380);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_368);
  LogicalType::~LogicalType(&local_408);
  LogicalType::LogicalType(&local_408,BIGINT);
  __l_00._M_len = 1;
  __l_00._M_array = &local_408;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_398,__l_00,(allocator_type *)&stack0xfffffffffffffbf7);
  LogicalType::LogicalType(&local_3b0,INTERVAL);
  local_3f0.super__Function_base._M_functor._8_8_ = 0;
  local_3f0.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::UnaryFunction<long,duckdb::interval_t,duckdb::ToMonthsOperator>;
  local_3f0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3f0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_350,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_350;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffbd4;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffbdc;
  ScalarFunction::ScalarFunction
            (&local_320,(vector<duckdb::LogicalType,_true> *)&local_398,&local_3b0,&local_3f0,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffffbe8,in_stack_fffffffffffffbf0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_320);
  ScalarFunction::~ScalarFunction(&local_320);
  LogicalType::~LogicalType(&local_350);
  ::std::_Function_base::~_Function_base(&local_3f0.super__Function_base);
  LogicalType::~LogicalType(&local_3b0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_398);
  LogicalType::~LogicalType(&local_408);
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                  ._M_impl.super__Vector_impl_data._M_start; function != pSVar1;
      function = function + 1) {
    BaseScalarFunction::SetReturnsError(&local_d0,&function->super_BaseScalarFunction);
    BaseScalarFunction::~BaseScalarFunction(&local_d0);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet GetIntegerIntervalFunctions() {
	ScalarFunctionSet function_set;
	function_set.AddFunction(ScalarFunction({LogicalType::INTEGER}, LogicalType::INTERVAL,
	                                        ScalarFunction::UnaryFunction<int32_t, interval_t, OP>));
	function_set.AddFunction(ScalarFunction({LogicalType::BIGINT}, LogicalType::INTERVAL,
	                                        ScalarFunction::UnaryFunction<int64_t, interval_t, OP>));
	for (auto &func : function_set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return function_set;
}